

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

void tcu::lookupLine(ColorLine *dst,ConstPixelBufferAccess *level,Sampler *sampler,int x0,int x1,
                    int y)

{
  undefined8 local_4c;
  undefined8 local_44;
  TextureFormat local_3c;
  undefined8 local_34;
  int local_2c;
  int local_28;
  int y_local;
  int x1_local;
  int x0_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  ColorLine *dst_local;
  
  local_2c = y;
  local_28 = x1;
  y_local = x0;
  _x1_local = sampler;
  sampler_local = (Sampler *)level;
  level_local = (ConstPixelBufferAccess *)dst;
  lookup<float>((tcu *)&local_3c,level,sampler,x0,y,0);
  level_local->m_format = local_3c;
  *(undefined8 *)(level_local->m_size).m_data = local_34;
  lookup<float>((tcu *)&local_4c,(ConstPixelBufferAccess *)sampler_local,_x1_local,local_28,local_2c
                ,0);
  *(undefined8 *)((level_local->m_size).m_data + 2) = local_4c;
  *(undefined8 *)((level_local->m_pitch).m_data + 1) = local_44;
  return;
}

Assistant:

static void lookupLine (ColorLine& dst, const ConstPixelBufferAccess& level, const Sampler& sampler, int x0, int x1, int y)
{
	dst.p0 = lookup<float>(level, sampler, x0, y, 0);
	dst.p1 = lookup<float>(level, sampler, x1, y, 0);
}